

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

module * __thiscall
pybind11::module::
def<OmegaOP*(*)(std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string),char[18],pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
          (module *this,char *name_,
          _func_OmegaOP_ptr_vector<double,_std::allocator<double>_>_vector<double,_std::allocator<double>_>_double_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_double_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          **f,char (*extra) [18],arg *extra_1,arg *extra_2,arg *extra_3,arg_v *extra_4,
          arg_v *extra_5,arg_v *extra_6)

{
  _func_OmegaOP_ptr_vector<double,_std::allocator<double>_>_vector<double,_std::allocator<double>_>_double_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_double_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *f_00;
  handle local_60;
  cpp_function func;
  object local_50;
  scope local_48;
  name local_40;
  sibling local_38;
  
  f_00 = *f;
  local_48.value.m_ptr = (handle)(this->super_object).super_handle.m_ptr;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40.value = name_;
  getattr((pybind11 *)&local_60,local_48.value,name_,(PyObject *)&_Py_NoneStruct);
  local_38.value.m_ptr = (handle)(handle)local_60.m_ptr;
  cpp_function::
  cpp_function<OmegaOP*,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string,pybind11::name,pybind11::scope,pybind11::sibling,char[18],pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
            (&func,f_00,&local_40,&local_48,&local_38,extra,extra_1,extra_2,extra_3,extra_4,extra_5,
             extra_6);
  object::~object((object *)&local_60);
  object::~object(&local_50);
  add_object(this,name_,(handle)func.super_function.super_object.super_handle.m_ptr,true);
  object::~object((object *)&func);
  return this;
}

Assistant:

module &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }